

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Segment::Segment(Segment *this)

{
  time_t tVar1;
  
  (this->cues_).cue_entries_capacity_ = 0;
  (this->cues_).cue_entries_size_ = 0;
  (this->cues_).cue_entries_ = (CuePoint **)0x0;
  (this->cues_).output_block_number_ = true;
  (this->seek_head_).seek_entry_id_[0] = 0;
  (this->seek_head_).seek_entry_id_[1] = 0;
  (this->seek_head_).seek_entry_id_[2] = 0;
  (this->seek_head_).seek_entry_id_[3] = 0;
  (this->seek_head_).seek_entry_id_[4] = 0;
  (this->seek_head_).seek_entry_pos_[0] = 0;
  (this->seek_head_).seek_entry_pos_[1] = 0;
  (this->seek_head_).seek_entry_pos_[2] = 0;
  (this->seek_head_).seek_entry_pos_[3] = 0;
  (this->seek_head_).seek_entry_pos_[4] = 0;
  (this->seek_head_).start_pos_ = 0;
  (this->segment_info_).duration_ = -1.0;
  (this->segment_info_).muxing_app_ = (char *)0x0;
  (this->segment_info_).timecode_scale_ = 1000000;
  (this->segment_info_).writing_app_ = (char *)0x0;
  (this->segment_info_).date_utc_ = -0x8000000000000000;
  (this->segment_info_).duration_pos_ = -1;
  (this->tracks_).track_entries_ = (Track **)0x0;
  (this->tracks_).track_entries_size_ = 0;
  (this->tracks_).wrote_tracks_ = false;
  this->chunking_base_name_ = (char *)0x0;
  this->cues_track_ = 0;
  this->force_new_cluster_ = false;
  this->chunk_count_ = 0;
  (this->tags_).tags_size_ = 0;
  (this->tags_).tags_count_ = 0;
  (this->tags_).tags_ = (Tag *)0x0;
  (this->chapters_).chapters_size_ = 0;
  (this->chapters_).chapters_count_ = 0;
  (this->chapters_).chapters_ = (Chapter *)0x0;
  this->chunk_name_ = (char *)0x0;
  this->chunk_writer_cluster_ = (MkvWriter *)0x0;
  this->chunk_writer_cues_ = (MkvWriter *)0x0;
  this->chunk_writer_header_ = (MkvWriter *)0x0;
  this->chunking_ = false;
  this->cluster_list_ = (Cluster **)0x0;
  this->cluster_list_capacity_ = 0;
  this->cluster_list_size_ = 0;
  this->cues_position_ = kAfterClusters;
  this->frames_ = (Frame **)0x0;
  this->frames_capacity_ = 0;
  this->frames_size_ = 0;
  this->has_video_ = false;
  this->header_written_ = false;
  this->last_block_duration_ = 0;
  this->last_timestamp_ = 0;
  this->max_cluster_duration_ = 30000000000;
  this->max_cluster_size_ = 0;
  this->mode_ = kFile;
  this->new_cuepoint_ = false;
  this->output_cues_ = true;
  this->accurate_cluster_duration_ = false;
  this->fixed_size_cluster_timecode_ = false;
  this->estimate_file_duration_ = false;
  *(undefined8 *)&this->ebml_header_size_ = 0;
  *(undefined8 *)((long)&this->payload_pos_ + 4) = 0;
  *(undefined8 *)((long)&this->size_position_ + 4) = 0x400000000;
  *(undefined4 *)((long)&this->writer_header_ + 4) = 0;
  *(undefined8 *)((long)&this->writer_cluster_ + 4) = 0;
  *(undefined8 *)((long)&this->writer_cues_ + 4) = 0;
  *(undefined8 *)&this->doc_type_version_written_ = 0;
  *(undefined8 *)((long)&this->duration_ + 4) = 0;
  tVar1 = time((time_t *)0x0);
  this->seed_ = (uint)tVar1;
  return;
}

Assistant:

Segment::Segment()
    : chunk_count_(0),
      chunk_name_(NULL),
      chunk_writer_cluster_(NULL),
      chunk_writer_cues_(NULL),
      chunk_writer_header_(NULL),
      chunking_(false),
      chunking_base_name_(NULL),
      cluster_list_(NULL),
      cluster_list_capacity_(0),
      cluster_list_size_(0),
      cues_position_(kAfterClusters),
      cues_track_(0),
      force_new_cluster_(false),
      frames_(NULL),
      frames_capacity_(0),
      frames_size_(0),
      has_video_(false),
      header_written_(false),
      last_block_duration_(0),
      last_timestamp_(0),
      max_cluster_duration_(kDefaultMaxClusterDuration),
      max_cluster_size_(0),
      mode_(kFile),
      new_cuepoint_(false),
      output_cues_(true),
      accurate_cluster_duration_(false),
      fixed_size_cluster_timecode_(false),
      estimate_file_duration_(false),
      ebml_header_size_(0),
      payload_pos_(0),
      size_position_(0),
      doc_type_version_(kDefaultDocTypeVersion),
      doc_type_version_written_(0),
      duration_(0.0),
      writer_cluster_(NULL),
      writer_cues_(NULL),
      writer_header_(NULL) {
  const time_t curr_time = time(NULL);
  seed_ = static_cast<unsigned int>(curr_time);
#ifdef _WIN32
  srand(seed_);
#endif
}